

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_faceid_spacing
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT faceid,REF_DBL set_normal_spacing,
          REF_DBL ceil_normal_spacing,REF_DBL tangential_aspect_ratio)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  bool bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_INT *vector;
  long lVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  REF_DBL *pRVar13;
  REF_DBL *unaff_RBP;
  char *pcVar14;
  long lVar15;
  int iVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  REF_DBL d [12];
  REF_DBL normal [3];
  REF_DBL m [6];
  REF_DBL logm [6];
  REF_INT nodes [27];
  uint local_238;
  double local_208 [4];
  double dStack_1e8;
  double local_1e0;
  double local_1d8 [4];
  double local_1b8;
  double local_1b0;
  REF_DBL local_1a0;
  REF_DBL local_198;
  REF_DBL local_190;
  double local_188;
  double dStack_180;
  double local_178;
  double local_168;
  REF_GRID local_160;
  long local_158;
  double local_150 [3];
  REF_EDGE local_138 [5];
  double local_110 [7];
  REF_DBL local_d8 [6];
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  local_1a0 = tangential_aspect_ratio;
  local_198 = ceil_normal_spacing;
  local_190 = set_normal_spacing;
  if ((long)ref_node->max < 0) {
    local_238 = 1;
    pcVar14 = "malloc hits of REF_INT negative";
  }
  else {
    vector = (REF_INT *)malloc((long)ref_node->max << 2);
    if (vector != (REF_INT *)0x0) {
      bVar3 = true;
      if (0 < ref_node->max) {
        lVar9 = 0;
        do {
          vector[lVar9] = 0;
          lVar9 = lVar9 + 1;
        } while (lVar9 < ref_node->max);
      }
      goto LAB_001fe798;
    }
    local_238 = 2;
    pcVar14 = "malloc hits of REF_INT NULL";
  }
  bVar3 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x92c,
         "ref_metric_faceid_spacing",pcVar14);
  vector = (REF_INT *)0x0;
LAB_001fe798:
  if (bVar3) {
    uVar5 = ref_node->max;
    local_160 = ref_grid;
    if ((int)uVar5 < 0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x92d,"ref_metric_faceid_spacing","malloc new_log_metric of REF_DBL negative");
      local_238 = 1;
    }
    else {
      unaff_RBP = (REF_DBL *)malloc((ulong)uVar5 * 0x30);
      if (unaff_RBP == (REF_DBL *)0x0) {
        bVar3 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x92d,"ref_metric_faceid_spacing","malloc new_log_metric of REF_DBL NULL");
        local_238 = 2;
        unaff_RBP = (REF_DBL *)0x0;
      }
      else {
        bVar3 = true;
        if ((ulong)uVar5 != 0) {
          uVar10 = 1;
          if (1 < (int)(uVar5 * 6)) {
            uVar10 = (ulong)(uVar5 * 6);
          }
          memset(unaff_RBP,0,uVar10 << 3);
        }
      }
    }
    if (bVar3) {
      if (0 < ref_cell->max) {
        local_150[1] = local_190 * 1e+20 * local_190;
        if (local_150[1] <= -local_150[1]) {
          local_150[1] = -local_150[1];
        }
        local_150[2] = 0.0;
        local_168 = 1.0 / (local_190 * local_190);
        iVar16 = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,iVar16,local_a8);
          if ((RVar4 == 0) && (local_a8[ref_cell->node_per] == faceid)) {
            uVar5 = ref_node_tri_normal(ref_node,local_a8,&local_188);
            if (uVar5 == 0) {
              uVar5 = ref_math_normalize(&local_188);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x933,"ref_metric_faceid_spacing",(ulong)uVar5,"normalize");
                local_238 = uVar5;
                goto LAB_001fe99c;
              }
              if (ref_cell->node_per < 1) {
                bVar3 = true;
              }
              else {
                lVar9 = 0;
                do {
                  local_150[0] = (double)(long)local_a8[lVar9];
                  local_158 = (long)local_150[0] * 6;
                  pRVar13 = metric + (long)local_150[0] * 6;
                  uVar5 = ref_matrix_diag_m(pRVar13,(REF_DBL *)local_138);
                  if (uVar5 == 0) {
                    uVar10 = 0xffffffff;
                    pdVar8 = local_110;
                    uVar11 = 0;
                    dVar19 = -2.0;
                    do {
                      dVar21 = *pdVar8 * local_178 +
                               pdVar8[-2] * local_188 + pdVar8[-1] * dStack_180;
                      if (dVar21 <= -dVar21) {
                        dVar21 = -dVar21;
                      }
                      if (dVar19 < dVar21) {
                        uVar10 = uVar11 & 0xffffffff;
                        dVar19 = dVar21;
                      }
                      uVar11 = uVar11 + 1;
                      pdVar8 = pdVar8 + 3;
                    } while (uVar11 != 3);
                    if ((int)uVar10 == -1) {
                      uVar12 = 0x8f4;
                      pcVar14 = "first_i not set";
                    }
                    else {
                      iVar7 = -1;
                      uVar11 = 0;
                      uVar17 = 0;
                      uVar18 = 0xbff00000;
                      do {
                        if ((uVar10 != uVar11) &&
                           ((iVar7 == -1 ||
                            ((double)CONCAT44(uVar18,uVar17) <= (double)local_138[uVar11] &&
                             (double)local_138[uVar11] != (double)CONCAT44(uVar18,uVar17))))) {
                          uVar17 = SUB84(local_138[uVar11],0);
                          uVar18 = (undefined4)((ulong)local_138[uVar11] >> 0x20);
                          iVar7 = (int)uVar11;
                        }
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != 3);
                      if (iVar7 == -1) {
                        uVar12 = 0x8fe;
                        pcVar14 = "second_i not set";
                      }
                      else {
                        if (iVar7 != (int)uVar10) {
                          local_1e0 = local_178;
                          local_208[3] = local_188;
                          dStack_1e8 = dStack_180;
                          uVar5 = ref_math_normalize(local_208 + 3);
                          if (uVar5 == 0) {
                            lVar6 = 0;
                            do {
                              local_1d8[lVar6] = (double)local_138[iVar7 * 3 + 3 + (int)lVar6];
                              lVar6 = lVar6 + 1;
                            } while (lVar6 != 3);
                            dVar21 = dStack_1e8 * local_1d8[1];
                            dVar20 = local_208[3] * local_1d8[0];
                            dVar19 = local_1e0 * local_1d8[2];
                            lVar6 = 6;
                            do {
                              local_208[lVar6] =
                                   local_150[lVar6] * -(dVar19 + dVar20 + dVar21) + local_208[lVar6]
                              ;
                              lVar6 = lVar6 + 1;
                            } while (lVar6 != 9);
                            uVar5 = ref_math_normalize(local_1d8);
                            if (uVar5 == 0) {
                              local_1d8[3] = dStack_1e8 * local_1d8[2] - local_1d8[1] * local_1e0;
                              local_1b8 = local_1e0 * local_1d8[0] - local_1d8[2] * local_208[3];
                              local_1b0 = local_208[3] * local_1d8[1] - local_1d8[0] * dStack_1e8;
                              uVar5 = ref_math_normalize(local_1d8 + 3);
                              if (uVar5 == 0) {
                                dVar19 = (pRVar13[5] * local_1e0 +
                                         pRVar13[2] * local_208[3] + dStack_1e8 * pRVar13[4]) *
                                         local_1e0 +
                                         (pRVar13[2] * local_1e0 +
                                         *pRVar13 * local_208[3] + pRVar13[1] * dStack_1e8) *
                                         local_208[3] +
                                         (pRVar13[4] * local_1e0 +
                                         pRVar13[1] * local_208[3] + pRVar13[3] * dStack_1e8) *
                                         dStack_1e8;
                                if (dVar19 < 0.0) {
                                  dVar19 = sqrt(dVar19);
                                }
                                else {
                                  dVar19 = SQRT(dVar19);
                                }
                                local_208[0] = dVar19 * dVar19;
                                dVar19 = (pRVar13[5] * local_1d8[2] +
                                         pRVar13[2] * local_1d8[0] + local_1d8[1] * pRVar13[4]) *
                                         local_1d8[2] +
                                         (pRVar13[2] * local_1d8[2] +
                                         *pRVar13 * local_1d8[0] + pRVar13[1] * local_1d8[1]) *
                                         local_1d8[0] +
                                         (pRVar13[4] * local_1d8[2] +
                                         pRVar13[1] * local_1d8[0] + pRVar13[3] * local_1d8[1]) *
                                         local_1d8[1];
                                if (dVar19 < 0.0) {
                                  dVar19 = sqrt(dVar19);
                                }
                                else {
                                  dVar19 = SQRT(dVar19);
                                }
                                local_208[1] = dVar19 * dVar19;
                                dVar19 = (pRVar13[5] * local_1b0 +
                                         pRVar13[2] * local_1d8[3] + local_1b8 * pRVar13[4]) *
                                         local_1b0 +
                                         (pRVar13[2] * local_1b0 +
                                         *pRVar13 * local_1d8[3] + pRVar13[1] * local_1b8) *
                                         local_1d8[3] +
                                         (pRVar13[4] * local_1b0 +
                                         pRVar13[1] * local_1d8[3] + pRVar13[3] * local_1b8) *
                                         local_1b8;
                                if (dVar19 < 0.0) {
                                  dVar19 = sqrt(dVar19);
                                }
                                else {
                                  dVar19 = SQRT(dVar19);
                                }
                                local_208[2] = dVar19 * dVar19;
                                uVar5 = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                       ,0x912,"ref_metric_closest_d",(ulong)uVar5,"third");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                     ,0x90e,"ref_metric_closest_d",(ulong)uVar5,"second");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                                   ,0x904,"ref_metric_closest_d",(ulong)uVar5,"first");
                          }
                          goto LAB_001feb92;
                        }
                        uVar12 = 0x8ff;
                        pcVar14 = "first_i same as second_i";
                      }
                    }
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,uVar12,"ref_metric_closest_d",pcVar14);
                    uVar5 = 1;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x8e8,"ref_metric_closest_d",(ulong)uVar5,"decomp");
                  }
LAB_001feb92:
                  if (uVar5 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0x938,"ref_metric_faceid_spacing",(ulong)uVar5,"closest");
                    local_238 = uVar5;
                    goto LAB_001febc8;
                  }
                  if (local_190 <= 0.0) {
LAB_001fec04:
                    if (0.0 < local_198) {
                      if (local_208[0] < 0.0) {
                        dVar19 = sqrt(local_208[0]);
                      }
                      else {
                        dVar19 = SQRT(local_208[0]);
                      }
                      if (local_208[0] < 0.0) {
                        dVar21 = sqrt(local_208[0]);
                      }
                      else {
                        dVar21 = SQRT(local_208[0]);
                      }
                      if (dVar21 * *(double *)(&DAT_0023f890 + (ulong)(0.0 < dVar19 * 1e+20) * 8) <=
                          1.0) {
                        uVar12 = 0x93f;
                      }
                      else {
                        if (local_208[0] < 0.0) {
                          dVar19 = sqrt(local_208[0]);
                        }
                        else {
                          dVar19 = SQRT(local_208[0]);
                        }
                        dVar21 = 1.0 / dVar19;
                        if (local_198 <= 1.0 / dVar19) {
                          dVar21 = local_198;
                        }
                        dVar19 = dVar21 * 1e+20 * dVar21;
                        if (dVar19 <= -dVar19) {
                          dVar19 = -dVar19;
                        }
                        if (1.0 < dVar19) {
                          local_208[0] = 1.0 / (dVar21 * dVar21);
                          goto LAB_001fed9d;
                        }
                        uVar12 = 0x942;
                      }
                      goto LAB_001feecf;
                    }
LAB_001fed9d:
                    if ((1.0 < local_1a0) &&
                       (dVar19 = local_208[1] * local_1a0 * local_1a0, local_208[2] <= dVar19)) {
                      local_208[2] = dVar19;
                    }
                    uVar5 = ref_matrix_form_m(local_208,(REF_DBL *)local_138);
                    if (uVar5 == 0) {
                      uVar5 = ref_matrix_log_m((REF_DBL *)local_138,local_d8);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x94c,"ref_metric_faceid_spacing",(ulong)uVar5,"form");
                        local_238 = uVar5;
                        goto LAB_001febc8;
                      }
                      lVar6 = 0;
                      do {
                        unaff_RBP[(int)local_158 + lVar6] =
                             local_d8[lVar6] + unaff_RBP[(int)local_158 + lVar6];
                        lVar6 = lVar6 + 1;
                      } while (lVar6 != 6);
                      vector[(long)local_150[0]] = vector[(long)local_150[0]] + 1;
                      bVar3 = true;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0x94b,"ref_metric_faceid_spacing",(ulong)uVar5,"form");
                      local_238 = uVar5;
LAB_001febc8:
                      bVar3 = false;
                    }
                  }
                  else {
                    if (1.0 < local_150[1]) {
                      local_208[0] = local_168;
                      goto LAB_001fec04;
                    }
                    uVar12 = 0x93b;
LAB_001feecf:
                    bVar3 = false;
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,uVar12,"ref_metric_faceid_spacing","eig 0");
                    local_238 = 1;
                  }
                } while ((bVar3) && (lVar9 = lVar9 + 1, lVar9 < ref_cell->node_per));
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x932,"ref_metric_faceid_spacing",(ulong)uVar5,"normal area");
              local_238 = uVar5;
LAB_001fe99c:
              bVar3 = false;
            }
            if (!bVar3) {
              return local_238;
            }
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 < ref_cell->max);
      }
      local_238 = ref_node_ghost_dbl(ref_node,unaff_RBP,6);
      if (local_238 == 0) {
        local_238 = ref_node_ghost_int(ref_node,vector,1);
        if (local_238 == 0) {
          if (0 < ref_node->max) {
            lVar9 = 0;
            pRVar13 = unaff_RBP;
            do {
              if ((-1 < ref_node->global[lVar9]) && (iVar16 = vector[lVar9], 0 < iVar16)) {
                lVar6 = 0;
                do {
                  pRVar13[lVar6] = pRVar13[lVar6] / (double)iVar16;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 6);
                vector[lVar9] = -1;
                uVar5 = ref_matrix_exp_m(unaff_RBP + lVar9 * 6,metric + lVar9 * 6);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x95f,"ref_metric_faceid_spacing",(ulong)uVar5,"form");
                  return uVar5;
                }
              }
              lVar9 = lVar9 + 1;
              pRVar13 = pRVar13 + 6;
            } while (lVar9 < ref_node->max);
          }
          local_238 = ref_edge_create(local_138,local_160);
          if (local_238 == 0) {
            if (0 < local_138[0]->n) {
              pRVar2 = local_138[0]->e2n;
              lVar9 = 0;
              do {
                iVar16 = pRVar2[lVar9 * 2];
                lVar6 = (long)iVar16;
                iVar7 = pRVar2[lVar9 * 2 + 1];
                iVar1 = vector[lVar6];
                if ((-1 < iVar1) && (vector[iVar7] == -1)) {
                  lVar15 = 0;
                  do {
                    unaff_RBP[lVar6 * 6 + lVar15] =
                         unaff_RBP[iVar7 * 6 + lVar15] + unaff_RBP[lVar6 * 6 + lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 6);
                  vector[lVar6] = iVar1 + 1;
                }
                iVar1 = vector[iVar7];
                if ((-1 < iVar1) && (vector[lVar6] == -1)) {
                  lVar6 = 0;
                  do {
                    unaff_RBP[iVar7 * 6 + lVar6] =
                         unaff_RBP[iVar16 * 6 + lVar6] + unaff_RBP[iVar7 * 6 + lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 6);
                  vector[iVar7] = iVar1 + 1;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < local_138[0]->n);
            }
            ref_edge_free(local_138[0]);
            local_238 = ref_node_ghost_dbl(ref_node,unaff_RBP,6);
            if (local_238 == 0) {
              local_238 = ref_node_ghost_int(ref_node,vector,1);
              if (local_238 == 0) {
                if (0 < ref_node->max) {
                  lVar9 = 0;
                  pRVar13 = unaff_RBP;
                  do {
                    if ((-1 < ref_node->global[lVar9]) && (iVar16 = vector[lVar9], 0 < iVar16)) {
                      lVar6 = 0;
                      do {
                        pRVar13[lVar6] = pRVar13[lVar6] / (double)iVar16;
                        lVar6 = lVar6 + 1;
                      } while (lVar6 != 6);
                      vector[lVar9] = -2;
                      uVar5 = ref_matrix_exp_m(unaff_RBP + lVar9 * 6,metric + lVar9 * 6);
                      if (uVar5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x984,"ref_metric_faceid_spacing",(ulong)uVar5,"form");
                        return uVar5;
                      }
                    }
                    lVar9 = lVar9 + 1;
                    pRVar13 = pRVar13 + 6;
                  } while (lVar9 < ref_node->max);
                }
                local_238 = ref_node_ghost_dbl(ref_node,metric,6);
                if (local_238 == 0) {
                  if (unaff_RBP != (REF_DBL *)0x0) {
                    free(unaff_RBP);
                  }
                  local_238 = 0;
                  if (vector != (REF_INT *)0x0) {
                    free(vector);
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0x988,"ref_metric_faceid_spacing",(ulong)local_238,"ghost metric");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0x97b,"ref_metric_faceid_spacing",(ulong)local_238,"ghost hits");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0x97a,"ref_metric_faceid_spacing",(ulong)local_238,"ghost metric");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x966,"ref_metric_faceid_spacing",(ulong)local_238,"orig edges");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x956,"ref_metric_faceid_spacing",(ulong)local_238,"ghost hits");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x955,"ref_metric_faceid_spacing",(ulong)local_238,"ghost metric");
      }
    }
  }
  return local_238;
}

Assistant:

REF_FCN REF_STATUS ref_metric_faceid_spacing(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_INT faceid,
                                             REF_DBL set_normal_spacing,
                                             REF_DBL ceil_normal_spacing,
                                             REF_DBL tangential_aspect_ratio) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL *new_log_metric;
  REF_INT *hits;
  REF_INT node;
  REF_INT i;
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (faceid == nodes[ref_cell_id_index(ref_cell)]) {
      REF_DBL normal[3];
      REF_INT cell_node;
      RSS(ref_node_tri_normal(ref_node, nodes, normal), "normal area");
      RSS(ref_math_normalize(normal), "normalize");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        REF_DBL d[12], m[6], logm[6];
        REF_DBL h;
        node = nodes[cell_node];
        RSS(ref_metric_closest_d(normal, &(metric[6 * node]), d), "closest");
        if (set_normal_spacing > 0.0) {
          h = set_normal_spacing;
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (ceil_normal_spacing > 0.0) {
          RAS(ref_math_divisible(1.0, sqrt(ref_matrix_eig(d, 0))), "eig 0");
          h = 1.0 / sqrt(ref_matrix_eig(d, 0));
          h = MIN(h, ceil_normal_spacing);
          RAS(ref_math_divisible(1.0, h * h), "eig 0");
          ref_matrix_eig(d, 0) = 1.0 / (h * h);
        }
        if (tangential_aspect_ratio > 1.0) {
          ref_matrix_eig(d, 2) =
              MAX(ref_matrix_eig(d, 2), ref_matrix_eig(d, 1) *
                                            tangential_aspect_ratio *
                                            tangential_aspect_ratio);
        }
        RSS(ref_matrix_form_m(d, m), "form");
        RSS(ref_matrix_log_m(m, logm), "form");
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node] += logm[i];
        }
        hits[node] += 1;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}